

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~ExceptionOr
          (ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  SocketAddress *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if (((this->value).ptr.isSet == true) &&
     (pSVar1 = (this->value).ptr.field_1.value.ptr, pSVar1 != (SocketAddress *)0x0)) {
    sVar2 = (this->value).ptr.field_1.value.size_;
    (this->value).ptr.field_1.value.ptr = (SocketAddress *)0x0;
    (this->value).ptr.field_1.value.size_ = 0;
    pAVar3 = (this->value).ptr.field_1.value.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pSVar1,0x88,sVar2,sVar2,0);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;